

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O3

IOTHUB_CLIENT_RESULT
IoTHubTransport_MQTT_Common_SendMessageDisposition
          (IOTHUB_DEVICE_HANDLE handle,IOTHUB_MESSAGE_HANDLE messageHandle,
          IOTHUBMESSAGE_DISPOSITION_RESULT disposition)

{
  IOTHUB_MESSAGE_RESULT IVar1;
  int iVar2;
  MESSAGE_DISPOSITION_CONTEXT *in_RAX;
  LOGGER_LOG p_Var3;
  IOTHUB_CLIENT_RESULT IVar4;
  PMQTTTRANSPORT_HANDLE_DATA transport_data;
  MESSAGE_DISPOSITION_CONTEXT *msgDispCtx;
  
  if (handle == (IOTHUB_DEVICE_HANDLE)0x0 || messageHandle == (IOTHUB_MESSAGE_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      IVar4 = IOTHUB_CLIENT_INVALID_ARG;
    }
    else {
      IVar4 = IOTHUB_CLIENT_INVALID_ARG;
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"IoTHubTransport_MQTT_Common_SendMessageDisposition",0xfa9,1,
                "Invalid argument (handle=%p, messageHandle=%p",handle,messageHandle);
    }
  }
  else {
    IVar4 = IOTHUB_CLIENT_OK;
    msgDispCtx = in_RAX;
    if (disposition < IOTHUBMESSAGE_ABANDONED) {
      msgDispCtx = (MESSAGE_DISPOSITION_CONTEXT *)0x0;
      IVar1 = IoTHubMessage_GetDispositionContext(messageHandle,&msgDispCtx);
      if (msgDispCtx == (MESSAGE_DISPOSITION_CONTEXT *)0x0 || IVar1 != IOTHUB_MESSAGE_OK) {
        p_Var3 = xlogging_get_log_function();
        IVar4 = IOTHUB_CLIENT_ERROR;
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                    ,"IoTHubTransport_MQTT_Common_SendMessageDisposition",0xfb5,1,
                    "invalid message handle (no disposition context found)");
        }
      }
      else {
        iVar2 = mqtt_client_send_message_response
                          (*(MQTT_CLIENT_HANDLE *)((long)handle + 0x70),msgDispCtx->packet_id,
                           msgDispCtx->qos_value);
        if (iVar2 == 0) {
          IVar4 = IOTHUB_CLIENT_OK;
        }
        else {
          p_Var3 = xlogging_get_log_function();
          IVar4 = IOTHUB_CLIENT_ERROR;
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                      ,"IoTHubTransport_MQTT_Common_SendMessageDisposition",0xfbe,1,
                      "Failed sending ACK for MQTT message (packet_id=%u)",
                      (ulong)msgDispCtx->packet_id);
          }
        }
      }
    }
    IoTHubMessage_Destroy(messageHandle);
  }
  return IVar4;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubTransport_MQTT_Common_SendMessageDisposition(IOTHUB_DEVICE_HANDLE handle, IOTHUB_MESSAGE_HANDLE messageHandle, IOTHUBMESSAGE_DISPOSITION_RESULT disposition)
{
    IOTHUB_CLIENT_RESULT result;
    if (handle == NULL || messageHandle == NULL)
    {
        LogError("Invalid argument (handle=%p, messageHandle=%p", handle, messageHandle);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        if (disposition == IOTHUBMESSAGE_ACCEPTED || disposition == IOTHUBMESSAGE_REJECTED)
        {
            MESSAGE_DISPOSITION_CONTEXT* msgDispCtx = NULL;

            if (IoTHubMessage_GetDispositionContext(messageHandle, &msgDispCtx) != IOTHUB_MESSAGE_OK ||
                msgDispCtx == NULL)
            {
                LogError("invalid message handle (no disposition context found)");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                PMQTTTRANSPORT_HANDLE_DATA transport_data = (PMQTTTRANSPORT_HANDLE_DATA)handle;

                if (mqtt_client_send_message_response(transport_data->mqttClient, msgDispCtx->packet_id, msgDispCtx->qos_value) != 0)
                {
                    LogError("Failed sending ACK for MQTT message (packet_id=%u)", msgDispCtx->packet_id);
                    result = IOTHUB_CLIENT_ERROR;
                }
                else
                {
                    result = IOTHUB_CLIENT_OK;
                }
            }
        }
        else
        {
            result = IOTHUB_CLIENT_OK;
        }

        // This will also destroy the disposition context.
        IoTHubMessage_Destroy(messageHandle);
    }

    return result;
}